

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_unittest.cpp
# Opt level: O2

void __thiscall Array_sub_ranges_by_range_Test::TestBody(Array_sub_ranges_by_range_Test *this)

{
  reference pvVar1;
  double *expected;
  char *pcVar2;
  int i;
  size_type i_00;
  double *actual;
  AssertHelper local_b8;
  AssertionResult gtest_ar_2;
  AssertHelper local_a0;
  by_value array2;
  array_reference_type view1;
  by_value array1;
  Range range1;
  
  memory::
  Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::Array<int,void>((Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
                     *)&array1.super_ArrayView<double,_memory::HostCoordinator<double>_>,10);
  for (i_00 = 0; i_00 != 10; i_00 = i_00 + 1) {
    pvVar1 = memory::
             ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&array1.super_ArrayView<double,_memory::HostCoordinator<double>_>,i_00);
    *pvVar1 = (double)(int)i_00;
  }
  range1.left_ = 5;
  range1.right_ = 10;
  memory::
  ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()(&view1,&array1.super_ArrayView<double,_memory::HostCoordinator<double>_>,&range1);
  gtest_ar_2._0_8_ =
       view1.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .size_;
  local_b8.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&array2,"view1.size()","5",(unsigned_long *)&gtest_ar_2,(int *)&local_b8);
  if (array2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (array2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*array2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&array2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_);
  gtest_ar_2._0_8_ = array1.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ + 5;
  local_b8.data_ =
       (AssertHelperData *)
       view1.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .pointer_;
  testing::internal::CmpHelperEQ<double*,double*>
            ((internal *)&array2,"array1.data()+5","view1.data()",(double **)&gtest_ar_2,
             (double **)&local_b8);
  if (array2.super_ArrayView<double,_memory::HostCoordinator<double>_>._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (array2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*array2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&array2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_);
  memory::
  Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::
  Array<memory::ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>&,void>
            ((Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
              *)&array2,&view1);
  local_b8.data_ =
       (AssertHelperData *)
       view1.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .pointer_;
  local_a0.data_ =
       (AssertHelperData *)array2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_
  ;
  testing::internal::CmpHelperNE<double*,double*>
            ((internal *)&gtest_ar_2,"view1.data()","array2.data()",(double **)&local_b8,
             (double **)&local_a0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_b8.data_ =
       (AssertHelperData *)
       view1.
       super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
       .size_;
  local_a0.data_ =
       (AssertHelperData *)array2.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_2,"view1.size()","array2.size()",(unsigned_long *)&local_b8,
             (unsigned_long *)&local_a0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  expected = array1.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ + 5;
  for (actual = array2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ + 5;
      actual != array2.super_ArrayView<double,_memory::HostCoordinator<double>_>.pointer_ +
                array2.super_ArrayView<double,_memory::HostCoordinator<double>_>.size_;
      actual = actual + 1) {
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar_2,"*it1","*it2",expected,actual);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&local_b8);
      pcVar2 = "";
      if (gtest_ar_2.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_unittest.cpp"
                 ,0x8d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_b8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_2.message_);
    expected = expected + 1;
  }
  memory::
  Array<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array(&array2);
  memory::
  Array<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array(&array1);
  return;
}

Assistant:

TEST(Array, sub_ranges_by_range) {
    using namespace memory;

    typedef Array<double, HostCoordinator<double> > by_value;
    typedef ArrayView<double, HostCoordinator<double> > by_reference;

    // check that a view of a subrange works
    by_value array1(10);
    for(int i=0; i<10; i++)
        array1[i] = double(i);

    Range range1(5,10);
    auto view1 = array1(range1);
    EXPECT_EQ(view1.size(), 5);
    EXPECT_EQ(array1.data()+5, view1.data());

    // create a copy of the data in a view
    // should contain a copy of the second half of array1
    by_value array2(view1);
    EXPECT_NE(view1.data(), array2.data());
    EXPECT_EQ(view1.size(), array2.size());
    auto it1 = array1.data()+5;
    auto it2 = array2.data()+5;
    while(it2!=array2.data()+array2.size()) {
        EXPECT_EQ(*it1, *it2);
        ++it2;
        ++it1;
    }
}